

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqFactoring.cpp
# Opt level: O3

ClauseIterator __thiscall
Inferences::ALASCA::EqFactoring::generateClauses(EqFactoring *this,Clause *premise)

{
  long *plVar1;
  long *plVar2;
  SelectedEquality *pSVar3;
  SelectedEquality *pSVar4;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
  *pDVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined4 uVar9;
  bool bVar10;
  ulong uVar11;
  _func_int **pp_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Clause *in_RDX;
  byte bVar13;
  undefined4 uVar14;
  shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> rest;
  shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> selected;
  undefined4 local_6a4;
  undefined8 local_6a0;
  Stack<Kernel::SelectedEquality> local_698;
  Stack<Kernel::SelectedEquality> local_678;
  EqFactoring *local_650;
  Clause *local_648;
  element_type *local_640;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_638;
  element_type *local_630;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_628;
  undefined1 local_620 [64];
  undefined1 local_5e0 [56];
  Value local_5a8;
  OptionBase<Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>
  local_5a0;
  undefined1 local_560;
  Value local_55c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  Clause *local_4f8;
  Clause *local_4f0;
  undefined1 local_4e8 [16];
  element_type *local_4d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d0;
  Clause *local_4c8;
  Clause *local_4c0;
  unsigned_long uStack_4b8;
  element_type *local_4b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  undefined1 local_470;
  undefined8 local_468;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
  local_3e0;
  undefined8 local_328;
  undefined8 uStack_320;
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
  local_318;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  Clause *local_238;
  undefined1 local_230 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  Value local_1b8;
  Value local_1b0 [15];
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>
  local_138;
  
  local_650 = this;
  local_648 = premise;
  local_4f0 = in_RDX;
  Kernel::AlascaState::selectedEqualities
            ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>_>
              *)&local_318,*(AlascaState **)&(premise->super_Unit)._inference.field_0x8,in_RDX,
             NOT_LESS,NOT_LEQ,false);
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter(&local_3e0,&local_318);
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)local_620,&local_3e0);
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)(local_4e8 + 8),
                  (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)local_620);
  local_408 = 0;
  uStack_400 = 0;
  local_418 = 0;
  uStack_410 = 0;
  local_428 = (Value)0x0;
  uStack_420 = 0;
  local_3f8 = 0;
  if (((bool)local_5e0[0x30] == true) &&
     (plVar2 = (long *)CONCAT71(local_5a8._1_7_,local_5a8._0_1_), plVar2 != (long *)0x0)) {
    plVar1 = plVar2 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._56_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._56_8_);
  }
  Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_620,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_4e8);
  Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_230,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_620);
  if ((local_5a8._0_1_ == '\x01') && ((Value)local_5a0._0_8_ != (Value)0x0)) {
    plVar2 = (long *)(local_5a0._0_8_ + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_5a0._0_8_ + 8))();
    }
  }
  if ((AlascaState *)local_5e0._0_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._0_8_);
  }
  if (((bool)local_470 == true) && ((Value)local_468 != (Value)0x0)) {
    plVar2 = (long *)(local_468 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_468 + 8))();
    }
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  if ((local_3e0._inn._current.
       super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
       ._isSome == true) &&
     (local_3e0._inn._current.
      super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_3e0._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_3e0._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8))();
    }
  }
  if (local_3e0._inn._master._inner._inner._func.cmp.cmpCache.
      super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e0._inn._master._inner._inner._func.cmp.cmpCache.
               super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_4e8,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_230);
  local_678._capacity = 0;
  local_678._stack = (SelectedEquality *)0x0;
  local_678._cursor = (SelectedEquality *)0x0;
  local_678._end = (SelectedEquality *)0x0;
  Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_620,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_4e8);
  bVar10 = Lib::
           FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
           ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_620);
  while (bVar10 != false) {
    Lib::
    FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
    ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
               *)local_620);
    uVar9 = local_55c._45_4_;
    uVar8 = local_55c.init._inner._inner.
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
            .
            super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
            ._content[0xc];
    uVar7 = local_55c.init._inner._inner.
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
            .
            super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
            ._content[0xb];
    uVar6 = local_55c._0_1_;
    if (local_55c.init._inner._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
        ._content[0xc] == '\x01') {
      bVar13 = local_55c.init._inner._inner.
               super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
               .
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
               .
               super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
               ._content[0x10] & 3;
      local_6a4 = local_55c._34_4_;
      local_6a0 = local_55c._26_8_;
      uVar14 = local_55c._18_4_;
    }
    else {
      bVar13 = 0;
      uVar14 = 0;
      local_6a0 = 0;
      local_6a4 = 0;
    }
    local_560 = false;
    local_3e0._0_7_ = local_55c._1_7_;
    local_3e0._7_4_ = local_55c._8_4_;
    if (local_678._cursor == local_678._end) {
      Lib::Stack<Kernel::SelectedEquality>::expand(&local_678);
    }
    pDVar5 = &((local_678._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    ;
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1b] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1c] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1d] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1e] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1f] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x20] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x21] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x22] = '\0';
    pDVar5 = &((local_678._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    ;
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x23] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x24] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x25] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x26] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x27] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x28] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x29] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x2a] = '\0';
    pDVar5 = &((local_678._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    ;
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xb] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xc] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xd] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xe] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xf] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x10] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x11] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x12] = '\0';
    pDVar5 = &((local_678._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    ;
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x13] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x14] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x15] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x16] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x17] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x18] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x19] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1a] = '\0';
    *(undefined8 *)
     (((local_678._cursor)->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      ._content + 0x2b) = 0;
    *(byte *)&((local_678._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
              .
              super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
         = uVar6 & 3;
    *(ulong *)((local_678._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
              .
              super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
              ._content = CONCAT17(local_3e0._7_1_,local_3e0._0_7_);
    *(undefined4 *)
     (((local_678._cursor)->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      ._content + 7) = local_3e0._7_4_;
    ((local_678._cursor)->_inner)._inner.
    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
    .
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    .
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    ._content[0xb] = uVar7;
    ((local_678._cursor)->_inner)._inner.
    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
    .
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    .
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    ._content[0xc] = uVar8;
    if (uVar8 != '\0') {
      pDVar5 = &((local_678._cursor)->_inner)._inner.
                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                .
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      ;
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x10] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x11] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x12] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x13] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x14] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x15] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x16] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x17] = '\0';
      pDVar5 = &((local_678._cursor)->_inner)._inner.
                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                .
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      ;
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x18] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x19] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1a] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1b] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1c] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1d] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1e] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1f] = '\0';
      pDVar5 = &((local_678._cursor)->_inner)._inner.
                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                .
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      ;
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1c] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1d] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1e] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1f] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x20] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x21] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x22] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x23] = '\0';
      pDVar5 = &((local_678._cursor)->_inner)._inner.
                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                .
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      ;
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x24] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x25] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x26] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x27] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x28] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x29] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x2a] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x2b] = '\0';
      ((local_678._cursor)->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      ._content[0x10] = bVar13;
      *(undefined4 *)
       (((local_678._cursor)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
        ._content + 0x11) = uVar14;
      *(undefined8 *)
       (((local_678._cursor)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
        ._content + 0x19) = local_6a0;
      *(undefined4 *)
       (((local_678._cursor)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
        ._content + 0x21) = local_6a4;
    }
    *(undefined4 *)
     (((local_678._cursor)->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      ._content + 0x2c) = uVar9;
    local_678._cursor = local_678._cursor + 1;
    bVar10 = Lib::
             FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
             ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                        *)local_620);
  }
  if ((local_5a8._0_1_ == '\x01') && ((Value)local_5a0._0_8_ != (Value)0x0)) {
    plVar2 = (long *)(local_5a0._0_8_ + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_5a0._0_8_ + 8))();
    }
  }
  if ((AlascaState *)local_5e0._0_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._0_8_);
  }
  if (((bool)local_470 == true) && ((Value)local_468 != (Value)0x0)) {
    plVar2 = (long *)(local_468 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_468 + 8))();
    }
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  Lib::make_shared<Lib::Stack<Kernel::SelectedEquality>,_true>((Lib *)&local_630,&local_678);
  if (local_678._stack != (SelectedEquality *)0x0) {
    uVar11 = local_678._capacity * 0x34 + 0xf & 0xfffffffffffffff0;
    if (uVar11 == 0) {
      *(undefined8 *)
       &((local_678._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_678._stack;
    }
    else if (uVar11 < 0x11) {
      *(undefined8 *)
       &((local_678._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_678._stack;
    }
    else if (uVar11 < 0x19) {
      *(undefined8 *)
       &((local_678._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_678._stack;
    }
    else if (uVar11 < 0x21) {
      *(undefined8 *)
       &((local_678._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_678._stack;
    }
    else if (uVar11 < 0x31) {
      *(undefined8 *)
       &((local_678._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_678._stack;
    }
    else if (uVar11 < 0x41) {
      *(undefined8 *)
       &((local_678._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_678._stack;
    }
    else {
      operator_delete(local_678._stack,0x10);
    }
  }
  if (((bool)local_1b8.init._0_1_ == true) && (local_1b0[0] != (Value)0x0)) {
    plVar2 = (long *)((long)local_1b0[0] + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_1b0[0] + 8))();
    }
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  if ((local_318._inn._current.
       super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
       ._isSome == true) &&
     (local_318._inn._current.
      super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_318._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_318._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8))();
    }
  }
  if (local_318._inn._master._inner._inner._func.cmp.cmpCache.
      super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318._inn._master._inner._inner._func.cmp.cmpCache.
               super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  Kernel::AlascaState::selectedEqualities
            ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>_>
              *)&local_318,*(AlascaState **)&(local_648->super_Unit)._inference.field_0x8,local_4f0,
             ANY,NOT_LEQ,false);
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter(&local_3e0,&local_318);
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)local_620,&local_3e0);
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)(local_4e8 + 8),
                  (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)local_620);
  local_408 = 0;
  uStack_400 = 0;
  local_418 = 0;
  uStack_410 = 0;
  local_428 = (Value)0x0;
  uStack_420 = 0;
  local_3f8 = 0;
  if (((bool)local_5e0[0x30] == true) &&
     (plVar2 = (long *)CONCAT71(local_5a8._1_7_,local_5a8._0_1_), plVar2 != (long *)0x0)) {
    plVar1 = plVar2 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._56_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._56_8_);
  }
  Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_620,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_4e8);
  Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_230,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_620);
  if ((local_5a8._0_1_ == '\x01') && ((Value)local_5a0._0_8_ != (Value)0x0)) {
    plVar2 = (long *)(local_5a0._0_8_ + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_5a0._0_8_ + 8))();
    }
  }
  if ((AlascaState *)local_5e0._0_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._0_8_);
  }
  if (((bool)local_470 == true) && ((Value)local_468 != (Value)0x0)) {
    plVar2 = (long *)(local_468 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_468 + 8))();
    }
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  if ((local_3e0._inn._current.
       super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
       ._isSome == true) &&
     (local_3e0._inn._current.
      super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_3e0._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_3e0._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8))();
    }
  }
  if (local_3e0._inn._master._inner._inner._func.cmp.cmpCache.
      super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e0._inn._master._inner._inner._func.cmp.cmpCache.
               super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_4e8,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_230);
  local_698._capacity = 0;
  local_698._stack = (SelectedEquality *)0x0;
  local_698._cursor = (SelectedEquality *)0x0;
  local_698._end = (SelectedEquality *)0x0;
  Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_620,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_4e8);
  bVar10 = Lib::
           FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
           ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_620);
  while (bVar10 != false) {
    Lib::
    FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
    ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
               *)local_620);
    uVar9 = local_55c._45_4_;
    uVar8 = local_55c.init._inner._inner.
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
            .
            super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
            ._content[0xc];
    uVar7 = local_55c.init._inner._inner.
            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
            .
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
            .
            super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
            ._content[0xb];
    uVar6 = local_55c._0_1_;
    if (local_55c.init._inner._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
        ._content[0xc] == '\x01') {
      bVar13 = local_55c.init._inner._inner.
               super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
               .
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
               .
               super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
               ._content[0x10] & 3;
      local_6a4 = local_55c._34_4_;
      local_6a0 = local_55c._26_8_;
      uVar14 = local_55c._18_4_;
    }
    else {
      bVar13 = 0;
      uVar14 = 0;
      local_6a0 = 0;
      local_6a4 = 0;
    }
    local_560 = false;
    local_3e0._0_7_ = local_55c._1_7_;
    local_3e0._7_4_ = local_55c._8_4_;
    if (local_698._cursor == local_698._end) {
      Lib::Stack<Kernel::SelectedEquality>::expand(&local_698);
    }
    pDVar5 = &((local_698._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    ;
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1b] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1c] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1d] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1e] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1f] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x20] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x21] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x22] = '\0';
    pDVar5 = &((local_698._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    ;
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x23] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x24] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x25] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x26] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x27] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x28] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x29] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x2a] = '\0';
    pDVar5 = &((local_698._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    ;
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xb] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xc] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xd] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xe] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0xf] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x10] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x11] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x12] = '\0';
    pDVar5 = &((local_698._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    ;
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x13] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x14] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x15] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x16] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x17] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x18] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x19] = '\0';
    (pDVar5->
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    )._content[0x1a] = '\0';
    *(undefined8 *)
     (((local_698._cursor)->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      ._content + 0x2b) = 0;
    *(byte *)&((local_698._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
              .
              super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
         = uVar6 & 3;
    *(ulong *)((local_698._cursor)->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
              .
              super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
              ._content = CONCAT17(local_3e0._7_1_,local_3e0._0_7_);
    *(undefined4 *)
     (((local_698._cursor)->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      ._content + 7) = local_3e0._7_4_;
    ((local_698._cursor)->_inner)._inner.
    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
    .
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    .
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    ._content[0xb] = uVar7;
    ((local_698._cursor)->_inner)._inner.
    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
    .
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
    .
    super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
    ._content[0xc] = uVar8;
    if (uVar8 != '\0') {
      pDVar5 = &((local_698._cursor)->_inner)._inner.
                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                .
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      ;
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x10] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x11] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x12] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x13] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x14] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x15] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x16] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x17] = '\0';
      pDVar5 = &((local_698._cursor)->_inner)._inner.
                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                .
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      ;
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x18] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x19] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1a] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1b] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1c] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1d] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1e] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1f] = '\0';
      pDVar5 = &((local_698._cursor)->_inner)._inner.
                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                .
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      ;
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1c] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1d] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1e] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x1f] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x20] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x21] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x22] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x23] = '\0';
      pDVar5 = &((local_698._cursor)->_inner)._inner.
                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                .
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      ;
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x24] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x25] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x26] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x27] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x28] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x29] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x2a] = '\0';
      (pDVar5->
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      )._content[0x2b] = '\0';
      ((local_698._cursor)->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      ._content[0x10] = bVar13;
      *(undefined4 *)
       (((local_698._cursor)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
        ._content + 0x11) = uVar14;
      *(undefined8 *)
       (((local_698._cursor)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
        ._content + 0x19) = local_6a0;
      *(undefined4 *)
       (((local_698._cursor)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
        ._content + 0x21) = local_6a4;
    }
    *(undefined4 *)
     (((local_698._cursor)->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
      .
      super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
      ._content + 0x2c) = uVar9;
    local_698._cursor = local_698._cursor + 1;
    bVar10 = Lib::
             FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
             ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                        *)local_620);
  }
  if ((local_5a8._0_1_ == '\x01') && ((Value)local_5a0._0_8_ != (Value)0x0)) {
    plVar2 = (long *)(local_5a0._0_8_ + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_5a0._0_8_ + 8))();
    }
  }
  if ((AlascaState *)local_5e0._0_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._0_8_);
  }
  if (((bool)local_470 == true) && ((Value)local_468 != (Value)0x0)) {
    plVar2 = (long *)(local_468 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_468 + 8))();
    }
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  Lib::make_shared<Lib::Stack<Kernel::SelectedEquality>,_true>((Lib *)&local_640,&local_698);
  if (local_698._stack != (SelectedEquality *)0x0) {
    uVar11 = local_698._capacity * 0x34 + 0xf & 0xfffffffffffffff0;
    if (uVar11 == 0) {
      *(undefined8 *)
       &((local_698._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_698._stack;
    }
    else if (uVar11 < 0x11) {
      *(undefined8 *)
       &((local_698._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_698._stack;
    }
    else if (uVar11 < 0x19) {
      *(undefined8 *)
       &((local_698._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_698._stack;
    }
    else if (uVar11 < 0x21) {
      *(undefined8 *)
       &((local_698._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_698._stack;
    }
    else if (uVar11 < 0x31) {
      *(undefined8 *)
       &((local_698._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_698._stack;
    }
    else if (uVar11 < 0x41) {
      *(undefined8 *)
       &((local_698._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_698._stack;
    }
    else {
      operator_delete(local_698._stack,0x10);
    }
  }
  if (((bool)local_1b8.init._0_1_ == true) && (local_1b0[0] != (Value)0x0)) {
    plVar2 = (long *)((long)local_1b0[0] + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_1b0[0] + 8))();
    }
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  if ((local_318._inn._current.
       super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
       ._isSome == true) &&
     (local_318._inn._current.
      super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_318._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_318._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8))();
    }
  }
  if (local_318._inn._master._inner._inner._func.cmp.cmpCache.
      super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318._inn._master._inner._inner._func.cmp.cmpCache.
               super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pSVar3 = local_630->_cursor;
  pSVar4 = local_630->_stack;
  local_328 = 0;
  uStack_320 = 0;
  if (local_628 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_628->_M_use_count = local_628->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_628->_M_use_count = local_628->_M_use_count + 1;
    }
  }
  local_4b0 = (element_type *)(((long)pSVar3 - (long)pSVar4 >> 2) * 0x4ec4ec4ec4ec4ec5);
  if (local_638 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_4d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_4d0._M_pi = local_638;
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_638->_M_use_count = local_638->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_638->_M_use_count = local_638->_M_use_count + 1;
    }
  }
  local_4f8 = local_648;
  local_318._inn._master._inner._inner._func.sel = NOT_LEQ;
  local_318._inn._master._inner._inner._func._4_4_ = 0;
  local_318._inn._master._inner._inner._func.cmp.cmpCache.
  super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_518 = 0;
  uStack_510 = 0;
  local_508 = 0;
  uStack_500 = 0;
  local_238 = local_648;
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_318._inn._master._inner._func.cl = local_648;
  local_318._0_8_ = 0;
  local_318._inn._master._func.this = (AlascaState *)0x0;
  local_318._inn._master._func.includeUnshieldedNumberVariables = false;
  local_318._inn._master._func._9_3_ = 0;
  local_318._inn._master._func.selSum = NOT_LEQ;
  local_318._inn._master._inner._func.this = (AlascaState *)0x0;
  local_3e0._inn._master._inner._func.cl = local_648;
  local_3e0._inn._master._inner._inner._func.sel = NOT_LEQ;
  local_3e0._inn._master._inner._inner._func._4_4_ = 0;
  local_3e0._inn._master._inner._inner._func.cmp.cmpCache.
  super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_3e0._0_7_ = 0;
  local_3e0._7_4_ = 0;
  local_3e0._inn._master._func.this._3_5_ = 0;
  local_4e8._0_8_ = local_630;
  local_4e8._8_8_ = local_628;
  local_4d8 = local_640;
  local_3e0._inn._master._func.includeUnshieldedNumberVariables = false;
  local_3e0._inn._master._func._9_3_ = 0;
  local_3e0._inn._master._func.selSum = NOT_LEQ;
  local_3e0._inn._master._inner._func.this = (AlascaState *)0x0;
  local_4c8 = local_648;
  local_4c0 = (Clause *)0x0;
  uStack_4b8 = 0;
  local_3e0._inn._master._inner._inner._func.cmp.cmpCache.
  super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0;
  local_318._inn._master._inner._inner._func.cmp.cmpCache.
  super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0;
  if (local_4b0 == (element_type *)0x0) {
    memset((OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
            *)&local_4a8,0,200);
  }
  else {
    Lib::
    MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
    ::next((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>
            *)local_230,
           (MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
            *)local_4e8);
    Lib::
    FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>
    ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>
                  *)local_620,
                 (FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>
                  *)local_230);
    Lib::
    Option<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>
    ::operator()((Option<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>
                  *)&local_4a8,
                 (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>
                  *)local_620);
    Lib::
    OptionBase<Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>
    ::~OptionBase(&local_5a0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._16_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._56_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._56_8_);
    }
    if ((Clause *)local_620._32_8_ != (Clause *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._32_8_);
    }
    if ((AlascaState *)local_620._8_8_ != (AlascaState *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._8_8_);
    }
    Lib::
    OptionBase<Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>
    ::~OptionBase((OptionBase<Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>
                   *)&local_1b0[0].init);
    if ((Clause *)local_1e0._M_pi != (Clause *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
    }
    if ((element_type *)local_1f8._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
    }
    if ((AlascaState *)local_210._M_pi != (AlascaState *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_);
    }
  }
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
                *)local_620,
               (FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>
                *)local_4e8);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
                *)&local_138,
               (FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>
                *)local_620);
  Lib::
  OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
  ::~OptionBase((OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
                 *)local_5e0);
  if ((element_type *)local_620._24_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._24_8_);
  }
  if ((AlascaState *)local_620._8_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._8_8_);
  }
  Lib::
  OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
  ::~OptionBase((OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
                 *)&local_4a8);
  if (local_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d0._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_);
  }
  pp_Var12 = (_func_int **)::operator_new(0x118,8);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
                *)local_620,&local_138);
  *(undefined4 *)(pp_Var12 + 1) = 0;
  *pp_Var12 = (_func_int *)&PTR__ProxyIterator_00b35c88;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
                *)(pp_Var12 + 2),
               (FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>
                *)local_620);
  (local_650->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
  super_InferenceEngine._vptr_InferenceEngine = pp_Var12;
  *(int *)(pp_Var12 + 1) = *(int *)(pp_Var12 + 1) + 1;
  Lib::
  OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
  ::~OptionBase((OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
                 *)local_5e0);
  if ((element_type *)local_620._24_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._24_8_);
  }
  if ((AlascaState *)local_620._8_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_620._8_8_);
  }
  Lib::
  OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
  ::~OptionBase(&local_138._current.
                 super_OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
               );
  if (local_138._master._func.rest.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138._master._func.rest.
               super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138._master._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138._master._func.selected.
               super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_638 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_638);
  }
  if (local_628 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_628);
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)local_650;
}

Assistant:

ClauseIterator EqFactoring::generateClauses(Clause* premise) 
{

  TIME_TRACE("alasca equality factoring generate")
  DEBUG("in: ", *premise)

  auto selected = Lib::make_shared(
      _shared->selectedEqualities(premise, 
                       /* literal */ SelectionCriterion::NOT_LESS, 
                       /* summand */ SelectionCriterion::NOT_LEQ,
                       /* include number vars */ false)
        .filter([](auto& s) { return s.positive(); })
        // .filter([](auto& s) { return !s.isFracNum() || !s.biggerSide().isVar(); })
        .template collect<Stack>());

  auto rest = Lib::make_shared(
      _shared->selectedEqualities(premise, 
                       /* literal */ SelectionCriterion::ANY, 
                       /* summand */ SelectionCriterion::NOT_LEQ,
                       /* include number vars */ false)
        .filter([](auto& s) { return s.positive(); })
        // .filter([](auto& s) { return !s.isFracNum() || !s.biggerSide().isVar(); })
        .template collect<Stack>());

  return pvi(range(0, selected->size())
      .flatMap([=](auto i) {
        return range(0, rest->size())
          .filter([=](auto j) { return (*selected)[i].litIdx() != (*rest)[j].litIdx(); })
          // .filter([=](auto j) { return (*selected)[i].numTraits() == (*rest)[j].numTraits(); })
          .flatMap([=](auto j) {
              auto& max = (*selected)[i];
              auto& other = (*rest)[j];
              return ifElseIter(

                  // both literals are the same. 
                  // we use a symmetry breaking index comparison
                  // TODO we could replace this == by _shared.equivalent
                  max.literal() == other.literal() && other.litIdx() < max.litIdx(), 
                  [&]() { return arrayIter(Stack<Clause*>{}); },

                  // only one is selected (= maximal)
                  [&]() { return concatIters(applyRule(other, max).intoIter()); });
          });
      }));
}